

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O0

void __thiscall
TEST_SimpleString_BuildStringFromUnsignedInteger_Test::testBody
          (TEST_SimpleString_BuildStringFromUnsignedInteger_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_70;
  SimpleString local_60 [2];
  SimpleString local_40;
  char *local_30;
  char *expected_string;
  SimpleString result;
  uint i;
  TEST_SimpleString_BuildStringFromUnsignedInteger_Test *this_local;
  
  result.bufferSize_._4_4_ = 0xff;
  StringFrom((uint)&expected_string);
  local_30 = "255";
  SimpleString::SimpleString(&local_40,"255");
  bVar1 = operator!=(&local_40,(SimpleString *)&expected_string);
  SimpleString::~SimpleString(&local_40);
  if (bVar1) {
    bVar1 = operator!=((SimpleString *)&expected_string,(SimpleString *)&expected_string);
    if (bVar1) {
      pUVar4 = UtestShell::getCurrent();
      (*pUVar4->_vptr_UtestShell[0x1c])
                (pUVar4,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x38c);
    }
    pUVar4 = UtestShell::getCurrent();
    StringFrom((char *)local_60);
    pcVar2 = SimpleString::asCharString(local_60);
    StringFrom(&local_70);
    pcVar3 = SimpleString::asCharString(&local_70);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0x16])
              (pUVar4,1,pcVar2,pcVar3,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x38c,pTVar5);
    SimpleString::~SimpleString(&local_70);
    SimpleString::~SimpleString(local_60);
  }
  else {
    pUVar4 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar4->_vptr_UtestShell[0xe])
              (pUVar4,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x38c,pTVar5);
  }
  SimpleString::~SimpleString((SimpleString *)&expected_string);
  return;
}

Assistant:

TEST(SimpleString, BuildStringFromUnsignedInteger)
{
    unsigned int i = 0xff;

    SimpleString result = StringFrom(i);
    const char* expected_string = "255";
    CHECK_EQUAL(expected_string, result);
}